

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake.c
# Opt level: O2

decaf_error_t decaf_sha3_update(decaf_keccak_sponge_s *decaf_sponge,uint8_t *in,size_t len)

{
  byte bVar1;
  uint __line;
  ulong uVar2;
  ulong uVar3;
  char *__assertion;
  ulong uVar4;
  
  bVar1 = decaf_sponge->params[0].rate;
  if (decaf_sponge->params[0].position < bVar1) {
    if (bVar1 < 200) {
      if (decaf_sponge->params[0].flags == 'A') {
        while (len != 0) {
          uVar2 = (ulong)decaf_sponge->params[0].position;
          uVar4 = decaf_sponge->params[0].rate - uVar2;
          uVar3 = 0;
          if (len < uVar4) goto LAB_00104b2c;
          for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
            decaf_sponge->state[0].b[uVar3 + uVar2] =
                 decaf_sponge->state[0].b[uVar3 + uVar2] ^ in[uVar3];
          }
          dokeccak(decaf_sponge);
          in = in + uVar4;
          len = len - uVar4;
        }
        goto LAB_00104b37;
      }
      __assertion = "decaf_sponge->params->flags == FLAG_ABSORBING";
      __line = 0x5f;
    }
    else {
      __assertion = "decaf_sponge->params->rate < sizeof(decaf_sponge->state)";
      __line = 0x5e;
    }
  }
  else {
    __assertion = "decaf_sponge->params->position < decaf_sponge->params->rate";
    __line = 0x5d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/shake.c"
                ,__line,
                "decaf_error_t decaf_sha3_update(struct decaf_keccak_sponge_s *restrict, const uint8_t *, size_t)"
               );
LAB_00104b2c:
  for (; len != uVar3; uVar3 = uVar3 + 1) {
    decaf_sponge->state[0].b[uVar3 + uVar2] = decaf_sponge->state[0].b[uVar3 + uVar2] ^ in[uVar3];
  }
  decaf_sponge->params[0].position = decaf_sponge->params[0].position + (char)len;
LAB_00104b37:
  return -(uint)(decaf_sponge->params[0].flags == 'A');
}

Assistant:

decaf_error_t decaf_sha3_update (
    struct decaf_keccak_sponge_s * __restrict__ decaf_sponge,
    const uint8_t *in,
    size_t len
) {
    assert(decaf_sponge->params->position < decaf_sponge->params->rate);
    assert(decaf_sponge->params->rate < sizeof(decaf_sponge->state));
    assert(decaf_sponge->params->flags == FLAG_ABSORBING);
    while (len) {
        size_t cando = decaf_sponge->params->rate - decaf_sponge->params->position, i;
        uint8_t* state = &decaf_sponge->state->b[decaf_sponge->params->position];
        if (cando > len) {
            for (i = 0; i < len; i += 1) state[i] ^= in[i];
            decaf_sponge->params->position += (uint8_t)len;
            break;
        } else {
            for (i = 0; i < cando; i += 1) state[i] ^= in[i];
            dokeccak(decaf_sponge);
            len -= cando;
            in += cando;
        }
    }
    return (decaf_sponge->params->flags == FLAG_ABSORBING) ? DECAF_SUCCESS : DECAF_FAILURE;
}